

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall
pbrt::RealisticCamera::DrawRayPathFromFilm
          (RealisticCamera *this,Ray *r,bool arrow,bool toOpticalIntercept)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  const_reference pvVar7;
  char *pcVar8;
  byte in_CL;
  byte in_DL;
  long in_RDI;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined8 uVar22;
  undefined1 extraout_var [60];
  undefined1 auVar23 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  Point3f PVar24;
  Vector3<float> VVar25;
  Float ta;
  Float eta_t;
  Float eta_i;
  Vector3f wt;
  Float apertureRadius2;
  Float r2;
  Point3f pHit;
  int vb;
  Float va;
  Float zCenter;
  Float radius;
  Normal3f n;
  Float t;
  bool isStop;
  LensElementInterface *element;
  int i;
  Ray ray;
  Float elementZ;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffffd40;
  Vector3<float> *in_stack_fffffffffffffd60;
  Float in_stack_fffffffffffffd7c;
  Ray *in_stack_fffffffffffffd80;
  Ray *pRVar26;
  char (*in_stack_fffffffffffffd88) [2];
  char (*in_stack_fffffffffffffd90) [2];
  char *in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  char (*in_stack_fffffffffffffdc0) [2];
  float *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  Float in_stack_fffffffffffffdd4;
  int *in_stack_fffffffffffffdd8;
  Normal3f *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  Float in_stack_fffffffffffffe0c;
  Float in_stack_fffffffffffffe10;
  Float in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  Ray *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  float local_1cc;
  Normal3f *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  Ray *in_stack_fffffffffffffe50;
  Float in_stack_fffffffffffffe5c;
  undefined8 in_stack_fffffffffffffe60;
  float local_18c;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  Tuple3<pbrt::Vector3,_float> local_fc [3];
  float local_d4;
  float fStack_d0;
  float local_b8;
  float local_70;
  int local_5c;
  Ray local_58;
  float local_20;
  byte local_1a;
  byte local_19;
  
  local_19 = in_DL & 1;
  local_1a = in_CL & 1;
  local_20 = 0.0;
  if ((DrawRayPathFromFilm(pbrt::Ray_const&,bool,bool)::LensFromCamera == '\0') &&
     (iVar5 = __cxa_guard_acquire(&DrawRayPathFromFilm(pbrt::Ray_const&,bool,bool)::LensFromCamera),
     iVar5 != 0)) {
    Scale(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
    __cxa_guard_release(&DrawRayPathFromFilm(pbrt::Ray_const&,bool,bool)::LensFromCamera);
  }
  Transform::operator()
            ((Transform *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             in_stack_fffffffffffffe20,
             (Float *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  printf("{ ");
  auVar15._0_4_ =
       TraceLensesFromFilm((RealisticCamera *)
                           CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                           (Ray *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                           (Ray *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  auVar15._4_60_ = extraout_var;
  if ((auVar15._0_4_ != 0.0) || (NAN(auVar15._0_4_))) {
    printf("RGBColor[.5, .5, .8]");
  }
  else {
    printf("Dashed, RGBColor[.8, .5, .5]");
  }
  sVar6 = pstd::
          vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
          ::size((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                  *)(in_RDI + 0x390));
  local_5c = (int)sVar6;
  while( true ) {
    iVar5 = local_5c;
    local_5c = iVar5 + -1;
    auVar23 = auVar15._8_56_;
    if (local_5c < 0) break;
    pvVar7 = pstd::
             vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
             ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                           *)(in_RDI + 0x390),(long)local_5c);
    local_20 = local_20 - pvVar7->thickness;
    bVar4 = pvVar7->curvatureRadius != 0.0;
    Normal3<float>::Normal3((Normal3<float> *)0x6970f0);
    if (bVar4) {
      bVar3 = IntersectSphericalElement
                        ((Float)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                         in_stack_fffffffffffffe50,
                         (Float *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                         in_stack_fffffffffffffe40);
      if (!bVar3) goto LAB_0069791a;
    }
    else {
      local_70 = -(local_58.o.super_Tuple3<pbrt::Point3,_float>.z - local_20) /
                 local_58.d.super_Tuple3<pbrt::Vector3,_float>.z;
    }
    if (local_70 < 0.0) {
      LogFatal<char_const(&)[2],char_const(&)[2],char_const(&)[2],float&,char_const(&)[2],int&>
                ((LogLevel)((ulong)in_stack_fffffffffffffdb0 >> 0x20),in_stack_fffffffffffffda8,
                 (int)((ulong)in_stack_fffffffffffffda0 >> 0x20),in_stack_fffffffffffffd98,
                 in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdc8,
                 (char (*) [2])CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                 in_stack_fffffffffffffdd8);
    }
    dVar9 = (double)local_58.o.super_Tuple3<pbrt::Point3,_float>.z;
    dVar10 = (double)local_58.o.super_Tuple3<pbrt::Point3,_float>.x;
    auVar23 = (undefined1  [56])0x0;
    pRVar26 = &local_58;
    PVar24 = Ray::operator()(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
    auVar12._0_8_ = PVar24.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar12._8_56_ = auVar23;
    vmovlpd_avx(auVar12._0_16_);
    in_stack_fffffffffffffdd8 = (int *)(double)PVar24.super_Tuple3<pbrt::Point3,_float>.z;
    auVar23 = (undefined1  [56])0x0;
    PVar24 = Ray::operator()(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
    auVar13._0_8_ = PVar24.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar13._8_56_ = auVar23;
    uVar22 = vmovlpd_avx(auVar13._0_16_);
    local_b8 = (float)uVar22;
    printf(", Line[{{%f, %f}, {%f, %f}}]",dVar9,dVar10,in_stack_fffffffffffffdd8,(double)local_b8);
    auVar23 = (undefined1  [56])0x0;
    PVar24 = Ray::operator()(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
    auVar14._0_8_ = PVar24.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar14._8_56_ = auVar23;
    uVar22 = vmovlpd_avx(auVar14._0_16_);
    local_d4 = (float)uVar22;
    fStack_d0 = SUB84(uVar22,4);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_d4),ZEXT416((uint)local_d4),
                             ZEXT416((uint)(fStack_d0 * fStack_d0)));
    auVar15 = ZEXT464((uint)auVar1._0_4_);
    if (pvVar7->apertureRadius * pvVar7->apertureRadius < auVar1._0_4_) goto LAB_0069791a;
    local_58.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = uVar22;
    local_58.o.super_Tuple3<pbrt::Point3,_float>.z = PVar24.super_Tuple3<pbrt::Point3,_float>.z;
    if (bVar4) {
      Vector3<float>::Vector3((Vector3<float> *)0x697428);
      if (local_5c < 1) {
LAB_006974ad:
        in_stack_fffffffffffffdd4 = 1.0;
      }
      else {
        pvVar7 = pstd::
                 vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                 ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                               *)(in_RDI + 0x390),(long)(iVar5 + -2));
        if ((pvVar7->eta == 0.0) && (!NAN(pvVar7->eta))) goto LAB_006974ad;
        pvVar7 = pstd::
                 vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                 ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                               *)(in_RDI + 0x390),(long)(iVar5 + -2));
        in_stack_fffffffffffffdd4 = pvVar7->eta;
      }
      auVar23 = (undefined1  [56])0x0;
      VVar25 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffffd40);
      auVar16._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar16._8_56_ = auVar23;
      vmovlpd_avx(auVar16._0_16_);
      VVar25 = Normalize<float>(in_stack_fffffffffffffd60);
      auVar17._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar17._8_56_ = auVar23;
      vmovlpd_avx(auVar17._0_16_);
      auVar15 = ZEXT1264(SUB6012((undefined1  [60])0x0,0)) << 0x20;
      bVar4 = Refract((Vector3f *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                      in_stack_fffffffffffffe00,(Float)((ulong)in_RDI >> 0x20),(Vector3f *)pRVar26);
      if (((bVar4 ^ 0xffU) & 1) != 0) goto LAB_0069791a;
      local_58.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_fc[0]._0_8_;
      local_58.d.super_Tuple3<pbrt::Vector3,_float>.z = local_fc[0].z;
    }
  }
  iVar5 = (int)&local_58 + 0xc;
  VVar25 = Normalize<float>(in_stack_fffffffffffffd60);
  local_58.d.super_Tuple3<pbrt::Vector3,_float>.z = VVar25.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._0_8_ = VVar25.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar18._8_56_ = auVar23;
  local_58.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlpd_avx(auVar18._0_16_);
  std::abs(iVar5);
  if ((local_1a & 1) != 0) {
    auVar23 = (undefined1  [56])0x0;
    PVar24 = Ray::operator()(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
    auVar19._0_8_ = PVar24.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar19._8_56_ = auVar23;
    vmovlpd_avx(auVar19._0_16_);
    dVar9 = (double)PVar24.super_Tuple3<pbrt::Point3,_float>.z;
    uVar22 = 0;
    PVar24 = Ray::operator()(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
    auVar1._8_8_ = uVar22;
    auVar1._0_8_ = PVar24.super_Tuple3<pbrt::Point3,_float>._0_8_;
    uVar22 = vmovlpd_avx(auVar1);
    local_18c = (float)uVar22;
    printf(", Point[{%f, %f}]",dVar9,(double)local_18c);
  }
  pcVar8 = "Line";
  if ((local_19 & 1) != 0) {
    pcVar8 = "Arrow";
  }
  dVar9 = (double)local_58.o.super_Tuple3<pbrt::Point3,_float>.z;
  dVar10 = (double)local_58.o.super_Tuple3<pbrt::Point3,_float>.x;
  auVar23 = (undefined1  [56])0x0;
  pRVar26 = &local_58;
  PVar24 = Ray::operator()(pRVar26,in_stack_fffffffffffffd7c);
  auVar20._0_8_ = PVar24.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar20._8_56_ = auVar23;
  vmovlpd_avx(auVar20._0_16_);
  dVar11 = (double)PVar24.super_Tuple3<pbrt::Point3,_float>.z;
  auVar23 = (undefined1  [56])0x0;
  PVar24 = Ray::operator()(pRVar26,in_stack_fffffffffffffd7c);
  auVar21._0_8_ = PVar24.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar21._8_56_ = auVar23;
  uVar22 = vmovlpd_avx(auVar21._0_16_);
  local_1cc = (float)uVar22;
  printf(", %s[{{%f, %f}, {%f, %f}}]",dVar9,dVar10,dVar11,(double)local_1cc,pcVar8);
  if ((local_1a & 1) != 0) {
    dVar9 = (double)local_58.o.super_Tuple3<pbrt::Point3,_float>.z;
    uVar22 = 0;
    PVar24 = Ray::operator()(pRVar26,in_stack_fffffffffffffd7c);
    auVar2._8_8_ = uVar22;
    auVar2._0_8_ = PVar24.super_Tuple3<pbrt::Point3,_float>._0_8_;
    vmovlpd_avx(auVar2);
    printf(", Line[{{%f, 0}, {%f, 0}}]",dVar9,
           (double)(PVar24.super_Tuple3<pbrt::Point3,_float>.z * 1.05));
  }
LAB_0069791a:
  printf("}");
  return;
}

Assistant:

void RealisticCamera::DrawRayPathFromFilm(const Ray &r, bool arrow,
                                          bool toOpticalIntercept) const {
    Float elementZ = 0;
    // Transform _ray_ from camera to lens system space
    static const Transform LensFromCamera = Scale(1, 1, -1);
    Ray ray = LensFromCamera(r);
    printf("{ ");
    if (TraceLensesFromFilm(r, nullptr) == 0) {
        printf("Dashed, RGBColor[.8, .5, .5]");
    } else
        printf("RGBColor[.5, .5, .8]");

    for (int i = elementInterfaces.size() - 1; i >= 0; --i) {
        const LensElementInterface &element = elementInterfaces[i];
        elementZ -= element.thickness;
        bool isStop = (element.curvatureRadius == 0);
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        if (isStop)
            t = -(ray.o.z - elementZ) / ray.d.z;
        else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, ray, &t, &n))
                goto done;
        }
        CHECK_GE(t, 0);

        printf(", Line[{{%f, %f}, {%f, %f}}]", ray.o.z, ray.o.x, ray(t).z, ray(t).x);

        // Test intersection point against element aperture
        Point3f pHit = ray(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        Float apertureRadius2 = element.apertureRadius * element.apertureRadius;
        if (r2 > apertureRadius2)
            goto done;
        ray.o = pHit;

        // Update ray path for element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = element.eta;
            Float eta_t = (i > 0 && elementInterfaces[i - 1].eta != 0)
                              ? elementInterfaces[i - 1].eta
                              : 1;
            if (!Refract(Normalize(-ray.d), n, eta_t / eta_i, &wt))
                goto done;
            ray.d = wt;
        }
    }

    ray.d = Normalize(ray.d);
    {
        Float ta = std::abs(elementZ / 4);
        if (toOpticalIntercept) {
            ta = -ray.o.x / ray.d.x;
            printf(", Point[{%f, %f}]", ray(ta).z, ray(ta).x);
        }
        printf(", %s[{{%f, %f}, {%f, %f}}]", arrow ? "Arrow" : "Line", ray.o.z, ray.o.x,
               ray(ta).z, ray(ta).x);

        // overdraw the optical axis if needed...
        if (toOpticalIntercept)
            printf(", Line[{{%f, 0}, {%f, 0}}]", ray.o.z, ray(ta).z * 1.05f);
    }

done:
    printf("}");
}